

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<void> __thiscall
kj::AsyncCapabilityStream::writeWithFds
          (AsyncCapabilityStream *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_kj::OwnFd> fds)

{
  undefined8 in_R9;
  undefined4 local_18;
  undefined4 uStack_10;
  
  local_18 = fds.ptr._0_4_;
  uStack_10 = (undefined4)fds.size_;
  (**(code **)(*(long *)data.ptr + 0x70))
            (this,data.ptr,data.size_,moreData.ptr,moreData.size_,in_R9,local_18,uStack_10);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> AsyncCapabilityStream::writeWithFds(
    ArrayPtr<const byte> data, ArrayPtr<const ArrayPtr<const byte>> moreData,
    ArrayPtr<const OwnFd> fds) {
  // HACK: OwnFd actually contains an `int` under the hood. We can reinterpret_cast to avoid
  //   unnecessary memory allocation.
  static_assert(sizeof(OwnFd) == sizeof(int), "this optimization won't work");
  auto intArray = arrayPtr(reinterpret_cast<const int*>(fds.begin()), fds.size());

  // Be extra-paranoid about aliasing rules by injecting a compiler barrier here. Probably
  // not necessary but also probably doesn't hurt.
#if _MSC_VER
  _ReadWriteBarrier();
#else
  __asm__ __volatile__("": : :"memory");
#endif

  return writeWithFds(data, moreData, intArray);
}